

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O2

void __thiscall BVFixed::CopyBits(BVFixed *this,BVFixed *bv,BVIndex i)

{
  ulong *puVar1;
  code *pcVar2;
  uint uVar3;
  sbyte sVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BOOLEAN BVar7;
  BVIndex BVar8;
  BVIndex BVar9;
  long lVar10;
  uint uVar11;
  ulong uVar13;
  undefined4 *local_40;
  ulong uVar12;
  
  AssertBV(this,bv);
  uVar11 = i >> 6;
  uVar12 = (ulong)uVar11;
  BVar8 = WordCount(bv);
  BVar9 = WordCount(this);
  uVar3 = BVar8 - uVar11;
  if (BVar9 < BVar8 - uVar11) {
    uVar3 = BVar9;
  }
  if ((i & 0x3f) == 0) {
    js_memcpy_s(this + 1,(ulong)(uVar3 << 3),bv + (ulong)uVar11 + 1,(ulong)(uVar3 << 3));
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    sVar4 = (sbyte)(i & 0x3f);
    uVar13 = uVar12;
    for (lVar10 = 0; (ulong)uVar3 << 3 != lVar10; lVar10 = lVar10 + 8) {
      BVar8 = WordCount(bv);
      if (BVar8 <= uVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                           ,0x10d,"(pos < bv->WordCount())","pos < bv->WordCount()");
        if (!bVar5) goto LAB_0060be44;
        *local_40 = 0;
      }
      *(ulong *)((long)&this[1].len + lVar10) =
           *(ulong *)((long)&bv[uVar12 + 1].len + lVar10) >> sVar4;
      uVar13 = uVar13 + 1;
      BVar8 = WordCount(bv);
      if (BVar8 <= uVar13) break;
      puVar1 = (ulong *)((long)&this[1].len + lVar10);
      *puVar1 = *puVar1 | *(long *)((long)&bv[uVar12 + 2].len + lVar10) << (0x40U - sVar4 & 0x3f);
    }
  }
  BVar8 = 0;
  do {
    if (this->len + i <= i + BVar8) {
      return;
    }
    BVar6 = Test(this,BVar8);
    BVar7 = Test(bv,i + BVar8);
    if (BVar6 != BVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                         ,0x11e,"(this->Test(curr - i) == bv->Test(curr))",
                         "this->Test(curr - i) == bv->Test(curr)");
      if (!bVar5) {
LAB_0060be44:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *local_40 = 0;
    }
    BVar8 = BVar8 + 1;
  } while( true );
}

Assistant:

void
BVFixed::CopyBits(const BVFixed * bv, BVIndex i)
{
    AssertBV(bv);
    BVIndex offset = BVUnit::Offset(i);
    BVIndex position = BVUnit::Position(i);
    BVIndex len = bv->WordCount() - position;
    BVIndex copylen = min(WordCount(), len);
    if (offset == 0)
    {
        js_memcpy_s(&this->data[0], copylen * sizeof(BVUnit), &bv->data[BVUnit::Position(i)], copylen * sizeof(BVUnit));
    }
    else
    {
        BVIndex pos = position;
        for (BVIndex j = 0; j < copylen; j++)
        {
            Assert(pos < bv->WordCount());
            this->data[j] = bv->data[pos];
            this->data[j].ShiftRight(offset);

            pos++;
            if (pos >= bv->WordCount())
            {
                break;
            }
            BVUnit temp = bv->data[pos];
            temp.ShiftLeft(BVUnit::BitsPerWord - offset);
            this->data[j].Or(temp);
        }
    }
#if DBG
    for (BVIndex curr = i; curr < i + this->Length(); curr++)
    {
        Assert(this->Test(curr - i) == bv->Test(curr));
    }
#endif
}